

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddAllocatedSlowWithCopy<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
          (RepeatedPtrFieldBase *this,
          Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
          *value,Arena *value_arena,Arena *my_arena)

{
  LogMessage *pLVar1;
  MessageLite *element;
  LogMessage local_50;
  Voidify local_39;
  Arena *local_38;
  Arena *my_arena_local;
  Arena *value_arena_local;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *value_local;
  RepeatedPtrFieldBase *this_local;
  Arena *local_10;
  
  local_38 = my_arena;
  my_arena_local = value_arena;
  value_arena_local = (Arena *)value;
  value_local = (Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
                 *)this;
  if ((my_arena == (Arena *)0x0) || (value_arena != (Arena *)0x0)) {
    if (my_arena != value_arena) {
      if (value_arena == (Arena *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_50,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
                   ,0x21d,"value_arena != nullptr");
        pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar1);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_50);
      }
      element = CloneSlow(my_arena,(MessageLite *)value);
      value_arena_local =
           (Arena *)cast<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                              (element);
    }
  }
  else {
    this_local = (RepeatedPtrFieldBase *)value;
    local_10 = my_arena;
    if (value != (Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
                  *)0x0) {
      ThreadSafeArena::AddCleanup
                (&my_arena->impl_,value,arena_delete_object<google::protobuf::MessageLite>);
    }
  }
  UnsafeArenaAddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
            (this,(Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_>
                   *)value_arena_local);
  return;
}

Assistant:

PROTOBUF_NOINLINE void AddAllocatedSlowWithCopy(
      // Pass value_arena and my_arena to avoid duplicate virtual call (value)
      // or load (mine).
      Value<TypeHandler>* value, Arena* value_arena, Arena* my_arena) {
    using H = CommonHandler<TypeHandler>;
    // Ensure that either the value is in the same arena, or if not, we do the
    // appropriate thing: Own() it (if it's on heap and we're in an arena) or
    // copy it to our arena/heap (otherwise).
    if (my_arena != nullptr && value_arena == nullptr) {
      my_arena->Own(value);
    } else if (my_arena != value_arena) {
      ABSL_DCHECK(value_arena != nullptr);
      value = cast<TypeHandler>(CloneSlow(my_arena, *value));
    }

    UnsafeArenaAddAllocated<H>(value);
  }